

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_event_detected_falling(APITests *this)

{
  initializer_list<std::pair<int,_bool>_> __l;
  initializer_list<std::pair<int,_bool>_> __l_00;
  allocator_type local_49;
  _Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> local_48;
  pair<int,_bool> local_30;
  undefined4 local_28;
  undefined1 local_24;
  int local_20;
  undefined1 local_1c;
  undefined4 local_18;
  undefined1 local_14;
  
  local_30.first = 0;
  local_30.second = true;
  local_28 = 1;
  local_24 = 0;
  local_20 = 0;
  local_1c = 1;
  local_14 = 0;
  __l._M_len = 4;
  __l._M_array = &local_30;
  local_18 = local_28;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_48,__l,
             &local_49);
  _test_events(this,1,FALLING,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_48,
               false,false);
  std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~_Vector_base
            (&local_48);
  local_30.second = false;
  local_28 = 0;
  local_24 = 1;
  local_1c = 0;
  local_18 = 0;
  local_14 = 1;
  __l_00._M_len = 4;
  __l_00._M_array = &local_30;
  local_30.first = 1;
  local_20 = 1;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_48,
             __l_00,&local_49);
  _test_events(this,0,FALLING,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_48,
               true,false);
  std::_Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void test_event_detected_falling()
    {
        _test_events(
            GPIO::HIGH, 
            GPIO::FALLING, 
            { 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}
            }, 
            false, 
            false
        );
        _test_events(
            GPIO::LOW, 
            GPIO::FALLING, 
            { 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false},
                {GPIO::LOW, true} 
            }, 
            true, 
            false
        );
    }